

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_EnsureNonQuadraticAsInRust_Test::
~Table_EnsureNonQuadraticAsInRust_Test(Table_EnsureNonQuadraticAsInRust_Test *this)

{
  Table_EnsureNonQuadraticAsInRust_Test *this_local;
  
  ~Table_EnsureNonQuadraticAsInRust_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, EnsureNonQuadraticAsInRust) {
  static const size_t kLargeSize = 1 << 15;

  IntTable t;
  for (size_t i = 0; i != kLargeSize; ++i) {
    t.insert(i);
  }

  // If this is quadratic, the test will timeout.
  IntTable t2;
  for (const auto& entry : t) t2.insert(entry);
}